

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendReadFIFOQueueRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 FIFOAddress)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ModbusSimulationDataGenerator *pMVar5;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  char local_3c;
  
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar4 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,0x18);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,(ulong)(FIFOAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,(ulong)(uint)(FIFOAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    uVar1 = this->crc_tab16
            [(ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7] >> 8 ^
                     this->crc_tab16
                     [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ FIFOAddress ^
                              this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]) &
                      0xff]) & 0xff ^ (uint)(FIFOAddress >> 8)];
    CreateModbusByte(this,(ulong)((ushort)(this->crc_tab16
                                           [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                     FIFOAddress ^
                                                    this->crc_tab16
                                                    [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe7]
                                                    ) & 0xff] >> 8 ^ uVar1) & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    value = (U64)(uVar1 >> 8);
  }
  else {
    bVar3 = (byte)(FIFOAddress >> 8);
    local_3c = (byte)FIFOAddress + DeviceID + bVar3;
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar4 = (uint)this_00;
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar2 = BinToLATIN1(pMVar5,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,0x31);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,0x38);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(pMVar5,bVar3 >> 4);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(pMVar5,(U8)((FIFOAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(pMVar5,(byte)FIFOAddress >> 4);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(pMVar5,(U8)(FIFOAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar5 = this_00;
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(pMVar5,(byte)(-local_3c - 0x18U) >> 4);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    bVar3 = BinToLATIN1(this_00,-local_3c - 0x18U & 0xf);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar4);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendReadFIFOQueueRequest( U8 DeviceID, U16 FIFOAddress )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x18 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FIFOAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( FIFOAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x18 );
        CRCValue = update_CRC( CRCValue, FIFOAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( FIFOAddress & 0xFF00 ) >> 8 );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x18;
        LRCvalue = LRCvalue + ( FIFOAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( FIFOAddress & 0xFF00 ) >> 8 );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '1' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '8' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( FIFOAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}